

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O2

void __thiscall
cppcms::sessions::session_file_storage_factory::session_file_storage_factory
          (session_file_storage_factory *this,string *path,int conc,int proc_no,bool force_lock)

{
  session_file_storage *this_00;
  string local_50;
  
  (this->super_session_storage_factory)._vptr_session_storage_factory =
       (_func_int **)&PTR_get_002b9180;
  this_00 = (session_file_storage *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_50,(string *)path);
  session_file_storage::session_file_storage(this_00,&local_50,conc,proc_no,force_lock);
  std::__shared_ptr<cppcms::sessions::session_file_storage,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::sessions::session_file_storage,void>
            ((__shared_ptr<cppcms::sessions::session_file_storage,(__gnu_cxx::_Lock_policy)2> *)
             &this->storage_,this_00);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

session_file_storage_factory::session_file_storage_factory(std::string path,int conc,int proc_no,bool force_lock) :
	storage_(new session_file_storage(path,conc,proc_no,force_lock))
{
}